

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sobol.cpp
# Opt level: O2

void __thiscall Sobol::CmdNext(Sobol *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  CommandBuffer *pCVar1;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  allocator_type local_61;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  local_60;
  __shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_48;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector(&local_60,__l,&local_61);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdBindDescriptorSets
            (pCVar1,&local_60,&this->m_pipeline_layout,VK_PIPELINE_BIND_POINT_COMPUTE,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  myvk::CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,0x20,0,4,&this->m_dimension);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::ComputePipeline,void>
            ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             &(this->m_compute_pipeline).
              super___shared_ptr<myvk::ComputePipeline,_(__gnu_cxx::_Lock_policy)2>);
  myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_60.
              super__Vector_base<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  myvk::CommandBuffer::CmdDispatch
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,1,1,1);
  return;
}

Assistant:

void Sobol::CmdNext(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) {
	command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline_layout, VK_PIPELINE_BIND_POINT_COMPUTE, {});
	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, 0, sizeof(uint32_t), &m_dimension);
	command_buffer->CmdBindPipeline(m_compute_pipeline);
	command_buffer->CmdDispatch(1, 1, 1);
}